

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O1

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char fmt_s [3];
  char firstLine [512];
  undefined2 local_22c;
  undefined1 local_22a;
  undefined1 local_228 [511];
  undefined1 local_29;
  
  if (_stdscr == 0) {
    iVar3 = -1;
    bVar1 = true;
  }
  else {
    iVar3 = *(short *)(_stdscr + 4) + 1;
    bVar1 = *(short *)(_stdscr + 6) < 0x40;
  }
  bVar2 = false;
  if ((!bVar1) && (bVar2 = false, 5 < iVar3)) {
    if ((this->super_cmCursesWidget).field_0x3c == '\x01') {
      local_22a = 0;
      local_22c = 0x7325;
      memset(local_228,0x20,0x200);
      local_29 = 0;
      move(iVar3 + -4,0);
      printw(&local_22c,local_228);
      move(iVar3 + -3,0);
      printw(&local_22c,local_228);
      move(iVar3 + -2,0);
      printw(&local_22c,local_228);
      move(iVar3 + -1,0);
      printw(&local_22c,local_228);
      move(iVar3 + -3,0);
      printw(&local_22c,"Editing option, press [enter] to confirm");
      move(iVar3 + -2,0);
      printw(&local_22c,"                press [esc] to cancel");
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    return false;
  }
  if (this->InEdit) {
    char fmt_s[] = "%s";
    char firstLine[512];
    // Clean the toolbar
    memset(firstLine, ' ', sizeof(firstLine));
    firstLine[511] = '\0';
    curses_move(y - 4, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 1, 0);
    printw(fmt_s, firstLine);

    curses_move(y - 3, 0);
    printw(fmt_s, "Editing option, press [enter] to confirm");
    curses_move(y - 2, 0);
    printw(fmt_s, "                press [esc] to cancel");
    return true;
  }
  return false;
}